

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

string * __thiscall
pybind11::detail::error_fetch_and_normalize::format_value_and_trace_abi_cxx11_
          (error_fetch_and_normalize *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  PyObject *pPVar4;
  _object *p_Var5;
  PyObject **ppPVar6;
  ulong uVar7;
  long in_RSI;
  string *in_RDI;
  PyFrameObject *b_frame;
  int lineno;
  PyCodeObject *f_code;
  PyFrameObject *frame;
  PyTracebackObject *tb;
  bool have_trace;
  Py_ssize_t length;
  char *buffer;
  object value_bytes;
  char *message_unavailable_exc;
  object value_str;
  string message_error_string;
  string *result;
  PyTypeObject *in_stack_fffffffffffffda8;
  handle in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  string local_1c0 [32];
  PyTypeObject *local_1a0;
  handle local_198;
  string local_190 [32];
  string local_170 [32];
  handle local_150;
  string local_148 [36];
  undefined4 local_124;
  long local_120;
  PyTypeObject *local_118;
  PyObject *local_110;
  byte local_102;
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  ulong local_c0;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  handle local_90;
  handle local_88;
  string local_80 [32];
  char *local_60;
  handle local_58;
  handle local_50 [3];
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::string(local_38);
  bVar2 = pybind11::handle::operator_cast_to_bool((handle *)(in_RSI + 8));
  if (bVar2) {
    pPVar4 = pybind11::handle::ptr((handle *)(in_RSI + 8));
    p_Var5 = (_object *)PyObject_Str(pPVar4);
    pybind11::handle::handle<_object_*,_0>(&local_58,p_Var5);
    reinterpret_steal<pybind11::object>(in_stack_fffffffffffffdb8);
    local_60 = "<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>";
    bVar2 = pybind11::handle::operator_cast_to_bool(local_50);
    if (bVar2) {
      ppPVar6 = pybind11::handle::ptr(local_50);
      p_Var5 = (_object *)PyUnicode_AsEncodedString(*ppPVar6,"utf-8","backslashreplace");
      pybind11::handle::handle<_object_*,_0>(&local_90,p_Var5);
      reinterpret_steal<pybind11::object>(in_stack_fffffffffffffdb8);
      bVar2 = pybind11::handle::operator_cast_to_bool(&local_88);
      in_stack_fffffffffffffdfc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdfc);
      if (bVar2) {
        local_b8 = (char *)0x0;
        local_c0 = 0;
        ppPVar6 = pybind11::handle::ptr(&local_88);
        iVar3 = PyBytes_AsStringAndSize(*ppPVar6,&local_b8,&local_c0);
        pcVar1 = local_b8;
        uVar7 = local_c0;
        if (iVar3 == -1) {
          detail::error_string_abi_cxx11_();
          std::__cxx11::string::operator=(local_38,local_e0);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::operator=
                    ((string *)in_RDI,"<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>");
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_100,pcVar1,uVar7,&local_101);
          std::__cxx11::string::operator=((string *)in_RDI,local_100);
          std::__cxx11::string::~string(local_100);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
        }
      }
      else {
        detail::error_string_abi_cxx11_();
        in_stack_fffffffffffffdf0 = &local_b0;
        std::__cxx11::string::operator=(local_38,(string *)in_stack_fffffffffffffdf0);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffdf0);
        std::__cxx11::string::operator=
                  ((string *)in_RDI,"<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>");
      }
      object::~object((object *)0x2a5e96);
    }
    else {
      detail::error_string_abi_cxx11_();
      std::__cxx11::string::operator=(local_38,local_80);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::operator=
                ((string *)in_RDI,"<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>");
    }
    object::~object((object *)0x2a5eb4);
  }
  else {
    std::__cxx11::string::operator=((string *)in_RDI,"<MESSAGE UNAVAILABLE>");
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"<EMPTY MESSAGE>");
  }
  local_102 = 0;
  bVar2 = pybind11::handle::operator_cast_to_bool((handle *)(in_RSI + 0x10));
  if (bVar2) {
    for (local_110 = pybind11::handle::ptr((handle *)(in_RSI + 0x10)); local_110[1].ob_refcnt != 0;
        local_110 = (PyObject *)local_110[1].ob_refcnt) {
    }
    local_118 = local_110[1].ob_type;
    _Py_XINCREF((PyObject *)0x2a5f8d);
    std::__cxx11::string::operator+=((string *)in_RDI,"\n\nAt:\n");
    while (local_118 != (PyTypeObject *)0x0) {
      local_120 = PyFrame_GetCode(local_118);
      local_124 = PyFrame_GetLineNumber(local_118);
      std::__cxx11::string::operator+=((string *)in_RDI,"  ");
      pybind11::handle::handle<_object_*,_0>(&local_150,*(_object **)(local_120 + 0x68));
      pybind11::handle::cast<std::__cxx11::string>((handle *)in_stack_fffffffffffffda8);
      std::__cxx11::string::operator+=((string *)in_RDI,local_148);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::operator+=((string *)in_RDI,'(');
      std::__cxx11::to_string(in_stack_fffffffffffffdfc);
      std::__cxx11::string::operator+=((string *)in_RDI,local_170);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::operator+=((string *)in_RDI,"): ");
      pybind11::handle::handle<_object_*,_0>(&local_198,*(_object **)(local_120 + 0x70));
      pybind11::handle::cast<std::__cxx11::string>((handle *)in_stack_fffffffffffffda8);
      std::__cxx11::string::operator+=((string *)in_RDI,local_190);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::operator+=((string *)in_RDI,'\n');
      _Py_DECREF((PyObject *)0x2a6124);
      in_stack_fffffffffffffda8 = (PyTypeObject *)PyFrame_GetBack(local_118);
      local_1a0 = in_stack_fffffffffffffda8;
      _Py_DECREF((PyObject *)0x2a6152);
      local_118 = local_1a0;
    }
    local_102 = 1;
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    if ((local_102 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,'\n');
    }
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   in_stack_fffffffffffffdf0);
    std::__cxx11::string::operator+=((string *)in_RDI,local_1c0);
    std::__cxx11::string::~string(local_1c0);
  }
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string format_value_and_trace() const {
        std::string result;
        std::string message_error_string;
        if (m_value) {
            auto value_str = reinterpret_steal<object>(PyObject_Str(m_value.ptr()));
            constexpr const char *message_unavailable_exc
                = "<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>";
            if (!value_str) {
                message_error_string = detail::error_string();
                result = message_unavailable_exc;
            } else {
                // Not using `value_str.cast<std::string>()`, to not potentially throw a secondary
                // error_already_set that will then result in process termination (#4288).
                auto value_bytes = reinterpret_steal<object>(
                    PyUnicode_AsEncodedString(value_str.ptr(), "utf-8", "backslashreplace"));
                if (!value_bytes) {
                    message_error_string = detail::error_string();
                    result = message_unavailable_exc;
                } else {
                    char *buffer = nullptr;
                    Py_ssize_t length = 0;
                    if (PyBytes_AsStringAndSize(value_bytes.ptr(), &buffer, &length) == -1) {
                        message_error_string = detail::error_string();
                        result = message_unavailable_exc;
                    } else {
                        result = std::string(buffer, static_cast<std::size_t>(length));
                    }
                }
            }
#if PY_VERSION_HEX >= 0x030B0000
            auto notes
                = reinterpret_steal<object>(PyObject_GetAttrString(m_value.ptr(), "__notes__"));
            if (!notes) {
                PyErr_Clear(); // No notes is good news.
            } else {
                auto len_notes = PyList_Size(notes.ptr());
                if (len_notes < 0) {
                    result += "\nFAILURE obtaining len(__notes__): " + detail::error_string();
                } else {
                    result += "\n__notes__ (len=" + std::to_string(len_notes) + "):";
                    for (ssize_t i = 0; i < len_notes; i++) {
                        PyObject *note = PyList_GET_ITEM(notes.ptr(), i);
                        auto note_bytes = reinterpret_steal<object>(
                            PyUnicode_AsEncodedString(note, "utf-8", "backslashreplace"));
                        if (!note_bytes) {
                            result += "\nFAILURE obtaining __notes__[" + std::to_string(i)
                                      + "]: " + detail::error_string();
                        } else {
                            char *buffer = nullptr;
                            Py_ssize_t length = 0;
                            if (PyBytes_AsStringAndSize(note_bytes.ptr(), &buffer, &length)
                                == -1) {
                                result += "\nFAILURE formatting __notes__[" + std::to_string(i)
                                          + "]: " + detail::error_string();
                            } else {
                                result += '\n';
                                result += std::string(buffer, static_cast<std::size_t>(length));
                            }
                        }
                    }
                }
            }
#endif
        } else {
            result = "<MESSAGE UNAVAILABLE>";
        }
        if (result.empty()) {
            result = "<EMPTY MESSAGE>";
        }

        bool have_trace = false;
        if (m_trace) {
#if !defined(PYPY_VERSION)
            auto *tb = reinterpret_cast<PyTracebackObject *>(m_trace.ptr());

            // Get the deepest trace possible.
            while (tb->tb_next) {
                tb = tb->tb_next;
            }

            PyFrameObject *frame = tb->tb_frame;
            Py_XINCREF(frame);
            result += "\n\nAt:\n";
            while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
                PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
                PyCodeObject *f_code = frame->f_code;
                Py_INCREF(f_code);
#    endif
                int lineno = PyFrame_GetLineNumber(frame);
                result += "  ";
                result += handle(f_code->co_filename).cast<std::string>();
                result += '(';
                result += std::to_string(lineno);
                result += "): ";
                result += handle(f_code->co_name).cast<std::string>();
                result += '\n';
                Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
                auto *b_frame = PyFrame_GetBack(frame);
#    else
                auto *b_frame = frame->f_back;
                Py_XINCREF(b_frame);
#    endif
                Py_DECREF(frame);
                frame = b_frame;
            }

            have_trace = true;
#endif //! defined(PYPY_VERSION)
        }

        if (!message_error_string.empty()) {
            if (!have_trace) {
                result += '\n';
            }
            result += "\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: " + message_error_string;
        }

        return result;
    }